

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[23],unsigned_long&,char_const(&)[4],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,char (*params) [23],unsigned_long *params_1,
          char (*params_2) [4],unsigned_long *params_3)

{
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  CappedArray<char,_26UL> local_80;
  CappedArray<char,_26UL> local_58;
  
  local_90 = toCharSequence<char_const(&)[23]>((char (*) [23])this);
  toCharSequence<unsigned_long&>(&local_58,(kj *)params,(unsigned_long *)local_90.size_);
  local_a0 = toCharSequence<char_const(&)[4]>((char (*) [4])params_1);
  toCharSequence<unsigned_long&>(&local_80,(kj *)params_2,(unsigned_long *)local_a0.size_);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)&local_90,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_26UL> *)&local_a0,(ArrayPtr<const_char> *)&local_80,
             (CappedArray<char,_26UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}